

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O2

void __thiscall
CRegexStack::push(CRegexStack *this,regex_frame_type typ,int start_ofs,int str_ofs,int curlen,
                 re_state_id state,re_state_id final,int iter)

{
  char *pcVar1;
  size_t sVar2;
  
  ensure_space(this,0x198);
  pcVar1 = this->buf_;
  sVar2 = this->used_;
  this->used_ = sVar2 + 0x24;
  *(regex_frame_type *)(pcVar1 + sVar2) = typ;
  *(int *)(pcVar1 + sVar2 + 4) = start_ofs;
  *(int *)(pcVar1 + sVar2 + 8) = str_ofs;
  *(int *)(pcVar1 + sVar2 + 0xc) = curlen;
  *(re_state_id *)(pcVar1 + sVar2 + 0x10) = state;
  *(re_state_id *)(pcVar1 + sVar2 + 0x14) = final;
  *(int *)(pcVar1 + sVar2 + 0x1c) = iter;
  *(int *)(pcVar1 + sVar2 + 0x20) = this->sp_;
  this->sp_ = ((int)pcVar1 + (int)sVar2) - *(int *)&this->buf_;
  return;
}

Assistant:

void push(regex_frame_type typ, int start_ofs, int str_ofs, int curlen,
              re_state_id state, re_state_id final, int iter)
    {
        /* 
         *   Ensure we have enough space for the base state structure plus a
         *   full complement of group registers, loop variables, and return
         *   value.  We might not actually need all of the registers and
         *   loop variables, so we won't commit all of this space yet, but
         *   check in advance to make sure we have it so that we don't have
         *   to check again when and if we get around to consuming
         *   group/loop slots.  
         */
        ensure_space(sizeof(regex_stack_entry)
                     + ((RE_GROUP_REG_CNT + RE_LOOP_VARS_MAX + 1)
                        *sizeof(regex_stack_var)));

        /* allocate the base stack frame */
        regex_stack_entry *fp =
            (regex_stack_entry *)alloc_space(sizeof(regex_stack_entry));

        /* set it up */
        fp->typ = typ;
        fp->start_ofs = start_ofs;
        fp->str_ofs = str_ofs;
        fp->curlen = curlen;
        fp->state = state;
        fp->final = final;
        fp->iter = iter;

        /* push it onto the stack */
        fp->prv_sp = sp_;
        sp_ = (char *)fp - buf_;
    }